

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseExternref(WastParser *this,Const *const_)

{
  undefined8 uVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Location loc;
  bool bVar2;
  Result result_00;
  Literal *pLVar3;
  size_type sVar4;
  const_pointer pvVar5;
  ParseIntType in_R8D;
  undefined8 in_R9;
  string_view v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  uintptr_t uStack_168;
  Result result;
  uint64_t ref_bits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  iterator local_138;
  size_type local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  Token local_110;
  TokenType local_cc;
  undefined1 auStack_c8 [4];
  TokenType token_type;
  char *pcStack_c0;
  anon_union_16_2_ecfd7102_for_Location_1 local_b8;
  undefined1 local_a8 [8];
  string_view sv;
  Literal literal;
  undefined1 local_60 [8];
  Token token;
  Const *const__local;
  WastParser *this_local;
  
  token.field_2.literal_.text._M_str = (char *)const_;
  Consume((Token *)local_60,this);
  bVar2 = Features::reference_types_enabled(&this->options_->features);
  if (bVar2) {
    Literal::Literal((Literal *)&sv._M_str);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_a8);
    GetLocation((Location *)auStack_c8,this);
    ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
    (token.field_2.literal_.text._M_str + 0x10))->offset = (size_t)local_b8.field_1.offset;
    *(undefined8 *)(token.field_2.literal_.text._M_str + 0x18) = local_b8._8_8_;
    *(size_t *)token.field_2.literal_.text._M_str = _auStack_c8;
    *(char **)(token.field_2.literal_.text._M_str + 8) = pcStack_c0;
    local_cc = Peek(this,0);
    if (local_cc == Int || local_cc == Last_Literal) {
      Consume(&local_110,this);
      pLVar3 = Token::literal(&local_110);
      sv._M_str = *(char **)pLVar3;
      local_a8 = (undefined1  [8])(pLVar3->text)._M_len;
      sv._M_len = (size_t)(pLVar3->text)._M_str;
      v._M_str = (char *)&stack0xfffffffffffffe98;
      v._M_len = sv._M_len;
      literal._0_8_ = local_a8;
      literal.text._M_len = sv._M_len;
      result_00 = ParseInt64((wabt *)local_a8,v,(uint64_t *)0x0,in_R8D);
      Const::set_externref((Const *)token.field_2.literal_.text._M_str,uStack_168);
      bVar2 = Failed(result_00);
      if (bVar2) {
        uVar1 = *(undefined8 *)(token.field_2.literal_.text._M_str + 0x10);
        loc = *(Location *)token.field_2.literal_.text._M_str;
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)&literal);
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)&literal);
        Error(this,loc,"invalid literal \"%.*s\"",sVar4 & 0xffffffff,pvVar5,uVar1,in_R9);
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"a numeric literal",(allocator<char> *)((long)&ref_bits + 7));
      local_138 = &local_158;
      local_130 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&ref_bits + 6));
      __l._M_len = local_130;
      __l._M_array = local_138;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_128,__l,(allocator_type *)((long)&ref_bits + 6));
      this_local._4_4_ = ErrorExpected(this,&local_128,"123");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&ref_bits + 6));
      local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138;
      do {
        local_1b8 = local_1b8 + -1;
        std::__cxx11::string::~string((string *)local_1b8);
      } while (local_1b8 != &local_158);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ref_bits + 7));
    }
  }
  else {
    literal.text._M_str = (char *)local_60;
    Error(this,0x253483);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseExternref(Const* const_) {
  WABT_TRACE(ParseExternref);
  Token token = Consume();
  if (!options_->features.reference_types_enabled()) {
    Error(token.loc, "externref not allowed");
    return Result::Error;
  }

  Literal literal;
  std::string_view sv;
  const_->loc = GetLocation();
  TokenType token_type = Peek();

  switch (token_type) {
    case TokenType::Nat:
    case TokenType::Int: {
      literal = Consume().literal();
      sv = literal.text;
      break;
    }
    default:
      return ErrorExpected({"a numeric literal"}, "123");
  }

  uint64_t ref_bits;
  Result result = ParseInt64(sv, &ref_bits, ParseIntType::UnsignedOnly);

  const_->set_externref(static_cast<uintptr_t>(ref_bits));

  if (Failed(result)) {
    Error(const_->loc, "invalid literal \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    // Return if parser get errors.
    return Result::Error;
  }

  return Result::Ok;
}